

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadersConfig.h
# Opt level: O0

void __thiscall jaegertracing::propagation::HeadersConfig::HeadersConfig(HeadersConfig *this)

{
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  HeadersConfig *local_10;
  HeadersConfig *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"",&local_b9);
  HeadersConfig(this,&local_30,&local_68,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

HeadersConfig()
        : HeadersConfig("", "", "", "")
    {
    }